

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

void __thiscall
LowererMDArch::EmitLongToInt(LowererMDArch *this,Opnd *dst,Opnd *src,Instr *instrInsert)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *instr;
  
  OVar2 = IR::Opnd::GetKind(dst);
  if ((OVar2 != OpndKindReg) || (dst->m_type != TyInt32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa4e,"(dst->IsRegOpnd() && dst->IsInt32())",
                       "dst->IsRegOpnd() && dst->IsInt32()");
    if (!bVar3) goto LAB_00650c60;
    *puVar4 = 0;
  }
  bVar3 = IRType_IsInt64(src->m_type);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa4f,"(src->IsInt64())","src->IsInt64()");
    if (!bVar3) {
LAB_00650c60:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  instr = IR::Instr::New(MOV_TRUNC,dst,src,instrInsert->m_func);
  IR::Instr::InsertBefore(instrInsert,instr);
  return;
}

Assistant:

void
LowererMDArch::EmitLongToInt(IR::Opnd *dst, IR::Opnd *src, IR::Instr *instrInsert)
{
    Assert(dst->IsRegOpnd() && dst->IsInt32());
    Assert(src->IsInt64());

    instrInsert->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC, dst, src, instrInsert->m_func));
}